

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

Aig_Man_t *
Saig_ManDupUnfoldConstrsFunc
          (Aig_Man_t *pAig,int nFrames,int nConfs,int nProps,int fOldAlgo,int fVerbose)

{
  ulong uVar1;
  uint uVar2;
  Vec_Vec_t *__ptr;
  Aig_Man_t *pAVar3;
  ulong uVar4;
  uint *__ptr_00;
  void *pvVar5;
  void *__ptr_01;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  Aig_Obj_t *pAVar12;
  long lVar13;
  int iVar14;
  
  if (fOldAlgo == 0) {
    __ptr = Ssw_ManFindDirectImplications(pAig,nFrames,nConfs,nProps,fVerbose);
  }
  else {
    __ptr = Saig_ManDetectConstrFunc(pAig,nFrames,nConfs,nProps,fVerbose);
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    if (0 < (long)__ptr->nSize) {
      lVar7 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + *(int *)((long)__ptr->pArray[lVar7] + 4);
        lVar7 = lVar7 + 1;
      } while (__ptr->nSize != lVar7);
      if (iVar11 != 0) {
        pAVar3 = Aig_ManDupWithoutPos(pAig);
        if ((long)__ptr->nSize < 1) {
          iVar11 = 0;
        }
        else {
          lVar7 = 0;
          iVar11 = 0;
          do {
            iVar11 = iVar11 + *(int *)((long)__ptr->pArray[lVar7] + 4);
            lVar7 = lVar7 + 1;
          } while (__ptr->nSize != lVar7);
        }
        pAVar3->nConstrs = iVar11 + pAig->nConstrs;
        if (0 < pAig->nTruePos) {
          lVar7 = 0;
          do {
            if (pAig->vCos->nSize <= lVar7) goto LAB_006dacda;
            pvVar5 = pAig->vCos->pArray[lVar7];
            if (((ulong)pvVar5 & 1) != 0) goto LAB_006dad22;
            uVar10 = *(ulong *)((long)pvVar5 + 8);
            uVar4 = uVar10 & 0xfffffffffffffffe;
            if (uVar4 == 0) {
              pAVar12 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar12 = (Aig_Obj_t *)((ulong)((uint)uVar10 & 1) ^ *(ulong *)(uVar4 + 0x28));
            }
            Aig_ObjCreateCo(pAVar3,pAVar12);
            lVar7 = lVar7 + 1;
          } while (lVar7 < pAig->nTruePos);
        }
        __ptr_00 = (uint *)malloc(0x10);
        __ptr_00[0] = 100;
        __ptr_00[1] = 0;
        pvVar5 = malloc(800);
        *(void **)(__ptr_00 + 2) = pvVar5;
        if (0 < __ptr->nSize) {
          lVar7 = 0;
          do {
            pvVar5 = __ptr->pArray[lVar7];
            if (0 < *(int *)((long)pvVar5 + 4)) {
              uVar2 = *__ptr_00;
              uVar10 = (ulong)__ptr_00[1];
              __ptr_01 = *(void **)(__ptr_00 + 2);
              lVar8 = 0;
              do {
                uVar4 = *(ulong *)(*(long *)((long)pvVar5 + 8) + lVar8 * 8);
                uVar1 = *(ulong *)((uVar4 & 0xfffffffffffffffe) + 0x28);
                uVar9 = (uint)uVar10;
                if (uVar9 == uVar2) {
                  if ((int)uVar2 < 0x10) {
                    if (__ptr_01 == (void *)0x0) {
                      __ptr_01 = malloc(0x80);
                    }
                    else {
                      __ptr_01 = realloc(__ptr_01,0x80);
                    }
                    uVar2 = 0x10;
                  }
                  else {
                    uVar6 = uVar2 * 2;
                    if (SBORROW4(uVar2,uVar6) != 0 < (int)uVar2) {
                      uVar2 = uVar6;
                      if (__ptr_01 == (void *)0x0) {
                        __ptr_01 = malloc((ulong)uVar6 << 3);
                      }
                      else {
                        __ptr_01 = realloc(__ptr_01,(ulong)uVar6 << 3);
                      }
                    }
                  }
                }
                uVar6 = uVar9 + 1;
                *(ulong *)((long)__ptr_01 + (long)(int)uVar9 * 8) = (uint)uVar4 & 1 ^ uVar1;
                if (lVar7 != 0) {
                  lVar13 = 0;
                  do {
                    pAVar12 = Aig_ObjCreateCi(pAVar3);
                    if (uVar6 + (int)lVar13 == uVar2) {
                      if ((int)uVar2 < 0x10) {
                        if (__ptr_01 == (void *)0x0) {
                          __ptr_01 = malloc(0x80);
                        }
                        else {
                          __ptr_01 = realloc(__ptr_01,0x80);
                        }
                        uVar2 = 0x10;
                      }
                      else {
                        uVar9 = uVar2 * 2;
                        if (SBORROW4(uVar2,uVar9) != 0 < (int)uVar2) {
                          uVar2 = uVar9;
                          if (__ptr_01 == (void *)0x0) {
                            __ptr_01 = malloc((ulong)uVar9 << 3);
                          }
                          else {
                            __ptr_01 = realloc(__ptr_01,(ulong)uVar9 << 3);
                          }
                        }
                      }
                    }
                    *(Aig_Obj_t **)((long)__ptr_01 + lVar13 * 8 + (long)(int)uVar6 * 8) = pAVar12;
                    lVar13 = lVar13 + 1;
                  } while (lVar7 != lVar13);
                  uVar6 = uVar6 + (int)lVar13;
                }
                if ((int)uVar6 < 1) {
                  __ptr_00[1] = uVar6;
                  *__ptr_00 = uVar2;
                  *(void **)(__ptr_00 + 2) = __ptr_01;
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
                }
                uVar10 = (ulong)(uVar6 - 1);
                Aig_ObjCreateCo(pAVar3,*(Aig_Obj_t **)((long)__ptr_01 + uVar10 * 8));
                lVar8 = lVar8 + 1;
              } while (lVar8 < *(int *)((long)pvVar5 + 4));
              __ptr_00[1] = uVar6 - 1;
              *__ptr_00 = uVar2;
              *(void **)(__ptr_00 + 2) = __ptr_01;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < __ptr->nSize);
        }
        if (0 < pAig->nRegs) {
          iVar11 = 0;
          do {
            uVar2 = pAig->nTruePos + iVar11;
            if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
LAB_006dacda:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar5 = pAig->vCos->pArray[uVar2];
            if (((ulong)pvVar5 & 1) != 0) {
LAB_006dad22:
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                            ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
            }
            uVar10 = *(ulong *)((long)pvVar5 + 8);
            uVar4 = uVar10 & 0xfffffffffffffffe;
            if (uVar4 == 0) {
              pAVar12 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar12 = (Aig_Obj_t *)((ulong)((uint)uVar10 & 1) ^ *(ulong *)(uVar4 + 0x28));
            }
            Aig_ObjCreateCo(pAVar3,pAVar12);
            iVar11 = iVar11 + 1;
          } while (iVar11 < pAig->nRegs);
        }
        if (__ptr->nSize < 1) {
          uVar2 = 0;
        }
        else {
          lVar7 = 0;
          uVar10 = 0;
          do {
            pvVar5 = __ptr->pArray[lVar7];
            if (0 < *(int *)((long)pvVar5 + 4)) {
              iVar11 = 0;
              do {
                if (lVar7 != 0) {
                  iVar14 = (int)uVar10;
                  lVar8 = 0;
                  do {
                    if ((iVar14 < 0) || ((int)__ptr_00[1] <= iVar14 + (int)lVar8))
                    goto LAB_006dacda;
                    Aig_ObjCreateCo(pAVar3,*(Aig_Obj_t **)
                                            (*(long *)(__ptr_00 + 2) + uVar10 * 8 + lVar8 * 8));
                    lVar8 = lVar8 + 1;
                  } while (lVar7 != lVar8);
                  uVar10 = (ulong)(uint)((int)lVar7 + iVar14);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < *(int *)((long)pvVar5 + 4));
            }
            uVar2 = (uint)uVar10;
            lVar7 = lVar7 + 1;
          } while (lVar7 < __ptr->nSize);
        }
        if (uVar2 != __ptr_00[1]) {
          __assert_fail("nNewFlops == Vec_PtrSize(vNewFlops)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr2.c"
                        ,0x39c,
                        "Aig_Man_t *Saig_ManDupUnfoldConstrsFunc(Aig_Man_t *, int, int, int, int, int)"
                       );
        }
        Aig_ManSetRegNum(pAVar3,uVar2 + pAig->nRegs);
        if (0 < __ptr->nSize) {
          lVar7 = 0;
          do {
            pvVar5 = __ptr->pArray[lVar7];
            if (pvVar5 != (void *)0x0) {
              if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar5 + 8));
                *(undefined8 *)((long)pvVar5 + 8) = 0;
              }
              free(pvVar5);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < __ptr->nSize);
        }
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (void **)0x0;
        }
        free(__ptr);
        if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
          free(*(void **)(__ptr_00 + 2));
          __ptr_00[2] = 0;
          __ptr_00[3] = 0;
        }
        free(__ptr_00);
        return pAVar3;
      }
    }
    if (__ptr != (Vec_Vec_t *)0x0) {
      if (0 < __ptr->nSize) {
        lVar7 = 0;
        do {
          pvVar5 = __ptr->pArray[lVar7];
          if (pvVar5 != (void *)0x0) {
            if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar5 + 8));
              *(undefined8 *)((long)pvVar5 + 8) = 0;
            }
            free(pvVar5);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < __ptr->nSize);
      }
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (void **)0x0;
      }
      free(__ptr);
    }
  }
  pAVar3 = Aig_ManDupDfs(pAig);
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManDupUnfoldConstrsFunc( Aig_Man_t * pAig, int nFrames, int nConfs, int nProps, int fOldAlgo, int fVerbose )
{
    Aig_Man_t * pNew;
    Vec_Vec_t * vCands;
    Vec_Ptr_t * vNodes, * vNewFlops;
    Aig_Obj_t * pObj;
    int i, j, k, nNewFlops;
    if ( fOldAlgo )
        vCands = Saig_ManDetectConstrFunc( pAig, nFrames, nConfs, nProps, fVerbose );
    else
        vCands = Ssw_ManFindDirectImplications( pAig, nFrames, nConfs, nProps, fVerbose );
    if ( vCands == NULL || Vec_VecSizeSize(vCands) == 0 )
    {
        Vec_VecFreeP( &vCands );
        return Aig_ManDupDfs( pAig );
    }
    // create new manager
    pNew = Aig_ManDupWithoutPos( pAig );
    pNew->nConstrs = pAig->nConstrs + Vec_VecSizeSize(vCands);
    // add normal POs
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create constraint outputs
    vNewFlops = Vec_PtrAlloc( 100 );
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Vec_PtrPush( vNewFlops, Aig_ObjRealCopy(pObj) );
            for ( j = 0; j < i; j++ )
                Vec_PtrPush( vNewFlops, Aig_ObjCreateCi(pNew) );
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrPop(vNewFlops) );
        }
    }
    // add latch outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // add new latch outputs
    nNewFlops = 0;
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            for ( j = 0; j < i; j++ )
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vNewFlops, nNewFlops++) );
        }
    }
    assert( nNewFlops == Vec_PtrSize(vNewFlops) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pAig) + nNewFlops );
    Vec_VecFreeP( &vCands );
    Vec_PtrFree( vNewFlops );
    return pNew;
}